

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O0

AssertionExpr *
slang::ast::ClockingAssertionExpr::fromSyntax
          (SignalEventExpressionSyntax *syntax,ASTContext *context)

{
  SourceRange sourceRange;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  socklen_t __len;
  ASTContext *in_RSI;
  Compilation *in_RDI;
  TimingControl *clocking;
  Compilation *comp;
  AssertionExpr *in_stack_ffffffffffffff48;
  Compilation *in_stack_ffffffffffffff50;
  ASTContext *in_stack_ffffffffffffff58;
  Compilation *args;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffff60;
  SourceLocation SVar3;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffff78;
  DiagCode in_stack_ffffffffffffff84;
  SyntaxNode *in_stack_ffffffffffffffa0;
  bitmask<slang::ast::ASTFlags> local_28;
  Compilation *local_20;
  ASTContext *local_18;
  Compilation *local_10;
  ClockingAssertionExpr *local_8;
  BumpAllocator *this;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_20 = ASTContext::getCompilation((ASTContext *)0x9a4294);
  SVar3 = (SourceLocation)&local_18->flags;
  bitmask<slang::ast::ASTFlags>::bitmask(&local_28,AssertionInstanceArgCheck);
  bVar1 = bitmask<slang::ast::ASTFlags>::has
                    ((bitmask<slang::ast::ASTFlags> *)in_stack_ffffffffffffff60.m_bits,
                     (bitmask<slang::ast::ASTFlags> *)in_stack_ffffffffffffff58);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    bitmask<slang::ast::ASTFlags>::bitmask
              ((bitmask<slang::ast::ASTFlags> *)&stack0xffffffffffffff78,NonProcedural);
    ASTContext::resetFlags(in_stack_ffffffffffffff58,in_stack_ffffffffffffff60);
    iVar2 = TimingControl::bind((int)local_10,(sockaddr *)&stack0xffffffffffffff80,__len);
    this = (BumpAllocator *)CONCAT44(extraout_var,iVar2);
    args = local_20;
    AssertionExpr::badExpr(local_10,(AssertionExpr *)local_18);
    local_8 = BumpAllocator::
              emplace<slang::ast::ClockingAssertionExpr,slang::ast::TimingControl&,slang::ast::AssertionExpr&>
                        (this,(TimingControl *)args,(AssertionExpr *)local_10);
  }
  else {
    slang::syntax::SyntaxNode::sourceRange(in_stack_ffffffffffffffa0);
    sourceRange.endLoc = (SourceLocation)in_stack_ffffffffffffff78.m_bits;
    sourceRange.startLoc = SVar3;
    ASTContext::addDiag(local_18,in_stack_ffffffffffffff84,sourceRange);
    local_8 = (ClockingAssertionExpr *)
              AssertionExpr::badExpr(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  }
  return &local_8->super_AssertionExpr;
}

Assistant:

AssertionExpr& ClockingAssertionExpr::fromSyntax(const SignalEventExpressionSyntax& syntax,
                                                 const ASTContext& context) {
    // If we are creating an argument then assume it's possible it could be used in an
    // event expression and allow this. Actual usage later on will report an error if
    // this ends up not being true. Otherwise this is just an error.
    auto& comp = context.getCompilation();
    if (!context.flags.has(ASTFlags::AssertionInstanceArgCheck)) {
        context.addDiag(diag::InvalidSignalEventInSeq, syntax.sourceRange());
        return badExpr(comp, nullptr);
    }

    auto& clocking = TimingControl::bind(syntax, context.resetFlags(ASTFlags::NonProcedural));
    return *comp.emplace<ClockingAssertionExpr>(clocking, badExpr(comp, nullptr));
}